

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLevel2DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,Vec2 *coord,int coordZ,IVec4 *result)

{
  ulong uVar1;
  long lVar2;
  int c;
  int y;
  int z;
  ulong uVar3;
  int j;
  int c_00;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar8 [16];
  Vector<bool,_4> res;
  Vector<int,_4> color;
  Vec2 vBounds;
  Vec2 uBounds;
  undefined4 local_5c;
  undefined1 local_58 [24];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(access->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(access->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar4 = floorf(local_38);
  fVar5 = floorf(local_34);
  fVar6 = floorf(local_40);
  c_00 = (int)fVar6;
  fVar6 = floorf(local_3c);
  if (c_00 <= (int)fVar6) {
    c = (int)fVar4;
    do {
      for (; c <= (int)fVar5; c = c + 1) {
        y = TexVerifierUtil::wrap(sampler->wrapS,c,(access->m_size).m_data[0]);
        z = TexVerifierUtil::wrap(sampler->wrapT,c_00,(access->m_size).m_data[1]);
        if ((((y < 0) || ((access->m_size).m_data[0] <= y)) || (z < 0)) ||
           ((((access->m_size).m_data[1] <= z || (coordZ < 0)) ||
            ((access->m_size).m_data[2] <= coordZ)))) {
          sampleTextureBorder<int>((TextureFormat *)local_58,(Sampler *)access);
        }
        else {
          ConstPixelBufferAccess::getPixelT<int>((ConstPixelBufferAccess *)local_58,(int)access,y,z)
          ;
        }
        uVar7 = -(uint)(result->m_data[0] < (int)local_58._0_4_);
        uVar9 = -(uint)(result->m_data[1] < (int)local_58._4_4_);
        uVar10 = -(uint)(result->m_data[2] < (int)local_58._8_4_);
        uVar11 = -(uint)(result->m_data[3] < (int)local_58._12_4_);
        auVar8._0_4_ = -(uint)((int)((prec->colorThreshold).m_data[0] ^ 0x80000000) <
                              (int)(uVar7 - (local_58._0_4_ - result->m_data[0] ^ uVar7) ^
                                   0x80000000));
        auVar8._4_4_ = -(uint)((int)((prec->colorThreshold).m_data[1] ^ 0x80000000) <
                              (int)(uVar9 - (local_58._4_4_ - result->m_data[1] ^ uVar9) ^
                                   0x80000000));
        auVar8._8_4_ = -(uint)((int)((prec->colorThreshold).m_data[2] ^ 0x80000000) <
                              (int)(uVar10 - (local_58._8_4_ - result->m_data[2] ^ uVar10) ^
                                   0x80000000));
        auVar8._12_4_ =
             -(uint)((int)((prec->colorThreshold).m_data[3] ^ 0x80000000) <
                    (int)(uVar11 - (local_58._12_4_ - result->m_data[3] ^ uVar11) ^ 0x80000000));
        auVar8 = packssdw(auVar8,auVar8);
        auVar8 = packsswb(auVar8 ^ _DAT_009a60c0,auVar8 ^ _DAT_009a60c0);
        local_5c = *(uint *)(prec->colorMask).m_data ^ 0x1010101 | auVar8._0_4_ & 0x1010101;
        if ((char)local_5c != '\0') {
          uVar3 = 0xffffffffffffffff;
          do {
            if (uVar3 == 2) {
              return true;
            }
            uVar1 = uVar3 + 1;
            lVar2 = uVar3 + 2;
            uVar3 = uVar1;
          } while (*(char *)((long)&local_5c + lVar2) != '\0');
          if (2 < uVar1) {
            return true;
          }
        }
      }
      c_00 = c_00 + 1;
      c = (int)fVar4;
    } while (c_00 <= (int)fVar6);
  }
  return false;
}

Assistant:

bool isLevel2DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const Vec2&					coord,
								 const int						coordZ,
								 const IVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coord, coordZ, result);
}